

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBalance.c
# Opt level: O3

Vec_Ptr_t * Abc_NodeFindCone_rec(Abc_Obj_t *pNode)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  Vec_Ptr_t *vSuper;
  void **ppvVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  Abc_Obj_t *pNodeE;
  Abc_Obj_t *pNodeT;
  Abc_Obj_t *local_30;
  Abc_Obj_t *local_28;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Abc_ObjIsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                  ,0x1ca,"Vec_Ptr_t *Abc_NodeFindCone_rec(Abc_Obj_t *)");
  }
  uVar2 = *(uint *)&pNode->field_0x14 & 0xf;
  if (uVar2 == 2) {
    return (Vec_Ptr_t *)0x0;
  }
  if (uVar2 == 5) {
    return (Vec_Ptr_t *)0x0;
  }
  vSuper = (Vec_Ptr_t *)malloc(0x10);
  vSuper->nCap = 8;
  vSuper->nSize = 0;
  ppvVar4 = (void **)malloc(0x40);
  vSuper->pArray = ppvVar4;
  iVar3 = Abc_NodeIsMuxType(pNode);
  if (iVar3 == 0) {
    iVar3 = Abc_NodeBalanceCone_rec(pNode,vSuper,1,1,0);
    if (vSuper->nSize < 2) {
      __assert_fail("vNodes->nSize > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcBalance.c"
                    ,0x1db,"Vec_Ptr_t *Abc_NodeFindCone_rec(Abc_Obj_t *)");
    }
    lVar10 = 0;
    do {
      puVar1 = (uint *)(((ulong)vSuper->pArray[lVar10] & 0xfffffffffffffffe) + 0x14);
      *puVar1 = *puVar1 & 0xffffffdf;
      lVar10 = lVar10 + 1;
      uVar8 = (ulong)vSuper->nSize;
    } while (lVar10 < (long)uVar8);
    if (iVar3 == -1) {
      vSuper->nSize = 0;
      return vSuper;
    }
    if (vSuper->nSize < 1) {
      return vSuper;
    }
  }
  else {
    pAVar5 = Abc_NodeRecognizeMux(pNode,&local_28,&local_30);
    vSuper->nSize = 1;
    *ppvVar4 = (void *)((ulong)pAVar5 & 0xfffffffffffffffe);
    uVar7 = 1;
    if ((void *)((ulong)pAVar5 & 0xfffffffffffffffe) !=
        (void *)((ulong)local_28 & 0xfffffffffffffffe)) {
      vSuper->nSize = 2;
      ppvVar4[1] = (void *)((ulong)local_28 & 0xfffffffffffffffe);
      uVar7 = 2;
    }
    uVar9 = 0;
    do {
      uVar8 = uVar7;
      if (ppvVar4[uVar9] == (void *)((ulong)local_30 & 0xfffffffffffffffe)) goto LAB_00296fb6;
      uVar9 = uVar9 + 1;
    } while (uVar7 != uVar9);
    uVar2 = (int)uVar7 + 1;
    uVar8 = (ulong)uVar2;
    vSuper->nSize = uVar2;
    ppvVar4[uVar7] = (void *)((ulong)local_30 & 0xfffffffffffffffe);
  }
LAB_00296fb6:
  lVar10 = 0;
  do {
    pAVar5 = (Abc_Obj_t *)((ulong)vSuper->pArray[lVar10] & 0xfffffffffffffffe);
    if ((pAVar5->field_6).pTemp == (void *)0x0) {
      pAVar6 = (Abc_Obj_t *)Abc_NodeFindCone_rec(pAVar5);
      (pAVar5->field_6).pCopy = pAVar6;
      uVar8 = (ulong)(uint)vSuper->nSize;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 < (int)uVar8);
  return vSuper;
}

Assistant:

Vec_Ptr_t * Abc_NodeFindCone_rec( Abc_Obj_t * pNode )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNodeC, * pNodeT, * pNodeE;
    int RetValue, i;
    assert( !Abc_ObjIsComplement(pNode) );
    if ( Abc_ObjIsCi(pNode) )
        return NULL;
    // start the new array
    vNodes = Vec_PtrAlloc( 4 );
    // if the node is the MUX collect its fanins
    if ( Abc_NodeIsMuxType(pNode) )
    {
        pNodeC = Abc_NodeRecognizeMux( pNode, &pNodeT, &pNodeE );
        Vec_PtrPush( vNodes, Abc_ObjRegular(pNodeC) );
        Vec_PtrPushUnique( vNodes, Abc_ObjRegular(pNodeT) );
        Vec_PtrPushUnique( vNodes, Abc_ObjRegular(pNodeE) );
    }
    else
    {
        // collect the nodes in the implication supergate
        RetValue = Abc_NodeBalanceCone_rec( pNode, vNodes, 1, 1, 0 );
        assert( vNodes->nSize > 1 );
        // unmark the visited nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            Abc_ObjRegular(pNode)->fMarkB = 0;
        // if we found the node and its complement in the same implication supergate, 
        // return empty set of nodes (meaning that we should use constant-0 node)
        if ( RetValue == -1 )
            vNodes->nSize = 0;
    }
    // call for the fanin
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNode = Abc_ObjRegular(pNode);
        if ( pNode->pCopy )
            continue;
        pNode->pCopy = (Abc_Obj_t *)Abc_NodeFindCone_rec( pNode );
    }
    return vNodes;
}